

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cxx
# Opt level: O2

Matrix * __thiscall Matrix::integrate(Matrix *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  int *piVar5;
  double *pdVar6;
  void *pvVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  int i;
  long lVar11;
  int iVar12;
  
  iVar2 = this->nMatrixDimension;
  uVar1 = iVar2 - 1;
  uVar8 = 0xffffffffffffffff;
  if (0 < iVar2) {
    uVar8 = (long)(int)uVar1 * 4;
  }
  pvVar7 = operator_new__(uVar8);
  uVar9 = 0;
  uVar8 = 0;
  if (0 < (int)uVar1) {
    uVar8 = (ulong)uVar1;
  }
  for (; uVar8 != uVar9; uVar9 = uVar9 + 1) {
    *(undefined4 *)((long)pvVar7 + uVar9 * 4) = 0;
  }
  piVar4 = this->pSize;
  do {
    if (uVar1 == 0) {
      bVar10 = true;
    }
    else {
      piVar5 = this->pSize;
      bVar10 = false;
      for (lVar11 = (long)(iVar2 + -2);
          (lVar11 != -1 &&
          (iVar12 = *(int *)((long)pvVar7 + lVar11 * 4) + 1,
          *(int *)((long)pvVar7 + lVar11 * 4) = iVar12, iVar12 == piVar5[lVar11]));
          lVar11 = lVar11 + -1) {
        *(undefined4 *)((long)pvVar7 + lVar11 * 4) = 0;
        bVar10 = (bool)(bVar10 | lVar11 == 0);
      }
    }
    iVar12 = 0;
    for (uVar9 = 0; uVar8 != uVar9; uVar9 = uVar9 + 1) {
      iVar12 = iVar12 + this->pMult[uVar9] * *(int *)((long)pvVar7 + uVar9 * 4);
    }
    iVar3 = piVar4[(int)uVar1];
    pdVar6 = this->pData;
    for (lVar11 = 1; lVar11 < iVar3; lVar11 = lVar11 + 1) {
      pdVar6[iVar12 + lVar11] = pdVar6[(long)iVar12 + lVar11 + -1] + pdVar6[iVar12 + lVar11];
    }
  } while (!bVar10);
  operator_delete__(pvVar7);
  return this;
}

Assistant:

Matrix &Matrix::integrate()
{
	int n = nMatrixDimension-1;
	bool done = false;
	int *indices = new int[n];
	for (int i=0; i<n; ++i)
		indices[i] = 0;
	
	while (!done) {
		
		// increase indices
		if (!n)
			done = true;
		else for (int dim=n-1; dim+1; --dim) {
			indices[dim]++;
			if (indices[dim] == pSize[dim]) {
				indices[dim] = 0;
				if (!dim) 
					done = true;
			} else
				break;
		}
		
		// create offset from indices
		int offset = 0;
		for (int i=0; i<n; ++i)
			offset += indices[i]*pMult[i];
		
		// integrate last dimension of this offset
		for (int i=1; i<pSize[n]; ++i)
			pData[offset+i] += pData[offset + i-1];
	}
	
	delete[] indices;
	return *this;
}